

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorpickermenu.cpp
# Opt level: O2

void __thiscall DColorPickerMenu::Destroy(DColorPickerMenu *this)

{
  FOptionMenuItem *pFVar1;
  uint amount;
  UCVarValue value;
  FOptionMenuDescriptor *pFVar2;
  uint i;
  int iVar3;
  
  if (-1 < this->mStartItem) {
    for (iVar3 = 0; iVar3 != 8; iVar3 = iVar3 + 1) {
      pFVar2 = (this->super_DOptionMenu).mDesc;
      amount = this->mStartItem;
      pFVar1 = (pFVar2->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array
               [iVar3 + amount];
      if (pFVar1 != (FOptionMenuItem *)0x0) {
        (*(pFVar1->super_FListMenuItem)._vptr_FListMenuItem[1])(pFVar1);
        pFVar2 = (this->super_DOptionMenu).mDesc;
        amount = this->mStartItem;
      }
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Resize
                (&(pFVar2->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,amount);
    }
    if (this->mCVar != (FColorCVar *)0x0) {
      value._0_4_ = (int)this->mBlue | (int)this->mGreen << 8 | (int)this->mRed << 0x10;
      value._4_4_ = 0;
      FBaseCVar::SetGenericRep((FBaseCVar *)this->mCVar,value,CVAR_Int);
    }
    this->mStartItem = -1;
  }
  return;
}

Assistant:

void Destroy() override
	{
		if (mStartItem >= 0)
		{
			for(unsigned i=0;i<8;i++)
			{
				delete mDesc->mItems[mStartItem+i];
				mDesc->mItems.Resize(mStartItem);
			}
			UCVarValue val;
			val.Int = MAKERGB(int(mRed), int(mGreen), int(mBlue));
			if (mCVar != NULL) mCVar->SetGenericRep (val, CVAR_Int);
			mStartItem = -1;
		}
	}